

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int cdef_filter_block_worker_hook(void *arg1,void *arg2)

{
  MB_MODE_INFO **ppMVar1;
  int nhfb;
  int fbr;
  int fbc;
  pthread_mutex_t *__mutex;
  CdefSearchCtx *cdef_search_ctx;
  CommonModeInfoParams *pCVar2;
  MB_MODE_INFO *pMVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  MB_MODE_INFO **ppMVar13;
  int c;
  ulong uVar14;
  int sb_count;
  int cur_fbc;
  int cur_fbr;
  
  __mutex = *arg2;
  cdef_search_ctx = *(CdefSearchCtx **)(*arg1 + 0x42c28);
  iVar5 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar5 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
LAB_001b5fb5:
    pthread_mutex_lock(*arg2);
    iVar5 = cdef_search_ctx->nvfb;
    nhfb = cdef_search_ctx->nhfb;
    while ((*(char *)((long)arg2 + 0x1c) == '\0' && (*(int *)((long)arg2 + 0x10) == 0))) {
      pCVar2 = cdef_search_ctx->mi_params;
      fbr = *(int *)((long)arg2 + 0x14);
      fbc = *(int *)((long)arg2 + 0x18);
      uVar6 = (ulong)fbc;
      lVar7 = (long)fbr * 0x10;
      lVar12 = lVar7 * pCVar2->mi_stride;
      uVar8 = pCVar2->mi_rows - (int)lVar7;
      if (0xf < (int)uVar8) {
        uVar8 = 0x10;
      }
      iVar10 = (int)(uVar6 << 4);
      uVar9 = pCVar2->mi_cols - iVar10;
      if (0xf < (int)uVar9) {
        uVar9 = 0x10;
      }
      ppMVar13 = pCVar2->mi_grid_base + lVar12 + uVar6 * 0x10;
      uVar11 = 0;
      if ((int)uVar9 < 1) {
        uVar9 = uVar11;
      }
      uVar4 = uVar11;
      if (0 < (int)uVar8) {
        uVar4 = uVar8;
      }
      pMVar3 = pCVar2->mi_grid_base[iVar10 + (int)lVar12];
      for (; uVar11 != uVar4; uVar11 = uVar11 + 1) {
        uVar14 = 0;
        while (uVar9 != uVar14) {
          ppMVar1 = ppMVar13 + uVar14;
          uVar14 = uVar14 + 1;
          if ((*ppMVar1)->skip_txfm == '\0') {
            if ((((int)uVar8 <= (int)uVar11) ||
                (((uVar6 & 1) != 0 && ((pMVar3->bsize & ~BLOCK_4X8) == BLOCK_128X64)))) ||
               ((((long)fbr & 1U) != 0 && ((pMVar3->bsize - BLOCK_64X128 & 0xfd) == 0))))
            goto LAB_001b60ac;
            iVar10 = cdef_search_ctx->sb_count;
            cdef_search_ctx->sb_count = iVar10 + 1;
            update_next_job_info((AV1CdefSync *)arg2,iVar5,nhfb);
            pthread_mutex_unlock(*arg2);
            av1_cdef_mse_calc_block
                      (cdef_search_ctx,(aom_internal_error_info *)((long)arg1 + 0x18),fbr,fbc,iVar10
                      );
            goto LAB_001b5fb5;
          }
        }
        ppMVar13 = ppMVar13 + pCVar2->mi_stride;
      }
LAB_001b60ac:
      update_next_job_info((AV1CdefSync *)arg2,iVar5,nhfb);
    }
    pthread_mutex_unlock(*arg2);
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar5 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg2 + 0x1c) = 1;
    pthread_mutex_unlock(__mutex);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int cdef_filter_block_worker_hook(void *arg1, void *arg2) {
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg2;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *cdef_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  CdefSearchCtx *cdef_search_ctx = thread_data->cpi->cdef_search_ctx;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(cdef_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(cdef_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr, cur_fbc, sb_count;
  while (cdef_get_next_job(cdef_sync, cdef_search_ctx, &cur_fbr, &cur_fbc,
                           &sb_count)) {
    av1_cdef_mse_calc_block(cdef_search_ctx, error_info, cur_fbr, cur_fbc,
                            sb_count);
  }
  error_info->setjmp = 0;
  return 1;
}